

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QXmlStreamAttribute>::emplace<QXmlStreamAttribute>
          (QMovableArrayOps<QXmlStreamAttribute> *this,qsizetype i,QXmlStreamAttribute *args)

{
  QXmlStreamAttribute **ppQVar1;
  qsizetype *pqVar2;
  QXmlStreamAttribute *pQVar3;
  long lVar4;
  Data *pDVar5;
  long lVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  qsizetype qVar9;
  qsizetype qVar10;
  QXmlStreamAttribute *pQVar11;
  Data *pDVar12;
  char16_t *pcVar13;
  Data *pDVar14;
  char16_t *pcVar15;
  Data *pDVar16;
  char16_t *pcVar17;
  Data *pDVar18;
  char16_t *pcVar19;
  byte bVar20;
  long in_FS_OFFSET;
  bool bVar21;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
           super_QArrayDataPointer<QXmlStreamAttribute>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_003a9f04:
    pDVar12 = (args->m_name).m_string.d;
    pcVar13 = (args->m_name).m_string.ptr;
    (args->m_name).m_string.d = (Data *)0x0;
    (args->m_name).m_string.ptr = (char16_t *)0x0;
    qVar7 = (args->m_name).m_string.size;
    (args->m_name).m_string.size = 0;
    pDVar14 = (args->m_namespaceUri).m_string.d;
    pcVar15 = (args->m_namespaceUri).m_string.ptr;
    (args->m_namespaceUri).m_string.d = (Data *)0x0;
    (args->m_namespaceUri).m_string.ptr = (char16_t *)0x0;
    qVar8 = (args->m_namespaceUri).m_string.size;
    (args->m_namespaceUri).m_string.size = 0;
    pDVar16 = (args->m_qualifiedName).m_string.d;
    pcVar17 = (args->m_qualifiedName).m_string.ptr;
    (args->m_qualifiedName).m_string.d = (Data *)0x0;
    (args->m_qualifiedName).m_string.ptr = (char16_t *)0x0;
    qVar9 = (args->m_qualifiedName).m_string.size;
    (args->m_qualifiedName).m_string.size = 0;
    pDVar18 = (args->m_value).m_string.d;
    pcVar19 = (args->m_value).m_string.ptr;
    (args->m_value).m_string.d = (Data *)0x0;
    (args->m_value).m_string.ptr = (char16_t *)0x0;
    qVar10 = (args->m_value).m_string.size;
    (args->m_value).m_string.size = 0;
    bVar20 = args->field_0x60 & 1;
    bVar21 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
             super_QArrayDataPointer<QXmlStreamAttribute>.size != 0;
    QArrayDataPointer<QXmlStreamAttribute>::detachAndGrow
              ((QArrayDataPointer<QXmlStreamAttribute> *)this,(uint)(i == 0 && bVar21),1,
               (QXmlStreamAttribute **)0x0,(QArrayDataPointer<QXmlStreamAttribute> *)0x0);
    pQVar11 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
              super_QArrayDataPointer<QXmlStreamAttribute>.ptr;
    if (i == 0 && bVar21) {
      pQVar11[-1].m_name.m_string.d = pDVar12;
      pQVar11[-1].m_name.m_string.ptr = pcVar13;
      pQVar11[-1].m_name.m_string.size = qVar7;
      pQVar11[-1].m_namespaceUri.m_string.d = pDVar14;
      pQVar11[-1].m_namespaceUri.m_string.ptr = pcVar15;
      pQVar11[-1].m_namespaceUri.m_string.size = qVar8;
      pQVar11[-1].m_qualifiedName.m_string.d = pDVar16;
      pQVar11[-1].m_qualifiedName.m_string.ptr = pcVar17;
      pQVar11[-1].m_qualifiedName.m_string.size = qVar9;
      pQVar11[-1].m_value.m_string.d = pDVar18;
      pQVar11[-1].m_value.m_string.ptr = pcVar19;
      pQVar11[-1].m_value.m_string.size = qVar10;
      pQVar11[-1].field_0x60 = pQVar11[-1].field_0x60 & 0xfe | bVar20;
      ppQVar1 = &(this->super_QGenericArrayOps<QXmlStreamAttribute>).
                 super_QArrayDataPointer<QXmlStreamAttribute>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      pQVar3 = pQVar11 + i;
      memmove(pQVar3 + 1,pQVar11 + i,
              ((this->super_QGenericArrayOps<QXmlStreamAttribute>).
               super_QArrayDataPointer<QXmlStreamAttribute>.size - i) * 0x68);
      (pQVar3->m_name).m_string.d = pDVar12;
      (pQVar3->m_name).m_string.ptr = pcVar13;
      (pQVar3->m_name).m_string.size = qVar7;
      (pQVar3->m_namespaceUri).m_string.d = pDVar14;
      (pQVar3->m_namespaceUri).m_string.ptr = pcVar15;
      (pQVar3->m_namespaceUri).m_string.size = qVar8;
      (pQVar3->m_qualifiedName).m_string.d = pDVar16;
      (pQVar3->m_qualifiedName).m_string.ptr = pcVar17;
      (pQVar3->m_qualifiedName).m_string.size = qVar9;
      (pQVar3->m_value).m_string.d = pDVar18;
      (pQVar3->m_value).m_string.ptr = pcVar19;
      (pQVar3->m_value).m_string.size = qVar10;
      pQVar3->field_0x60 = pQVar3->field_0x60 & 0xfe | bVar20;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QXmlStreamAttribute>).
              super_QArrayDataPointer<QXmlStreamAttribute>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    lVar6 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
            super_QArrayDataPointer<QXmlStreamAttribute>.size;
    if ((lVar6 == i && pDVar5 != (Data *)0x0) &&
       ((pDVar5->super_QArrayData).alloc - lVar6 !=
        ((long)((long)(this->super_QGenericArrayOps<QXmlStreamAttribute>).
                      super_QArrayDataPointer<QXmlStreamAttribute>.ptr -
               ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x4ec4ec4ec4ec4ec5)) {
      pQVar11 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
                super_QArrayDataPointer<QXmlStreamAttribute>.ptr;
      pDVar12 = (args->m_name).m_string.d;
      (args->m_name).m_string.d = (Data *)0x0;
      pQVar11[lVar6].m_name.m_string.d = pDVar12;
      pcVar13 = (args->m_name).m_string.ptr;
      (args->m_name).m_string.ptr = (char16_t *)0x0;
      pQVar11[lVar6].m_name.m_string.ptr = pcVar13;
      qVar7 = (args->m_name).m_string.size;
      (args->m_name).m_string.size = 0;
      pQVar11[lVar6].m_name.m_string.size = qVar7;
      pDVar12 = (args->m_namespaceUri).m_string.d;
      (args->m_namespaceUri).m_string.d = (Data *)0x0;
      pQVar11[lVar6].m_namespaceUri.m_string.d = pDVar12;
      pcVar13 = (args->m_namespaceUri).m_string.ptr;
      (args->m_namespaceUri).m_string.ptr = (char16_t *)0x0;
      pQVar11[lVar6].m_namespaceUri.m_string.ptr = pcVar13;
      qVar7 = (args->m_namespaceUri).m_string.size;
      (args->m_namespaceUri).m_string.size = 0;
      pQVar11[lVar6].m_namespaceUri.m_string.size = qVar7;
      pDVar12 = (args->m_qualifiedName).m_string.d;
      (args->m_qualifiedName).m_string.d = (Data *)0x0;
      pQVar11[lVar6].m_qualifiedName.m_string.d = pDVar12;
      pcVar13 = (args->m_qualifiedName).m_string.ptr;
      (args->m_qualifiedName).m_string.ptr = (char16_t *)0x0;
      pQVar11[lVar6].m_qualifiedName.m_string.ptr = pcVar13;
      qVar7 = (args->m_qualifiedName).m_string.size;
      (args->m_qualifiedName).m_string.size = 0;
      pQVar11[lVar6].m_qualifiedName.m_string.size = qVar7;
      pDVar12 = (args->m_value).m_string.d;
      (args->m_value).m_string.d = (Data *)0x0;
      pQVar11[lVar6].m_value.m_string.d = pDVar12;
      pcVar13 = (args->m_value).m_string.ptr;
      (args->m_value).m_string.ptr = (char16_t *)0x0;
      pQVar11[lVar6].m_value.m_string.ptr = pcVar13;
      qVar7 = (args->m_value).m_string.size;
      (args->m_value).m_string.size = 0;
      pQVar11[lVar6].m_value.m_string.size = qVar7;
      pQVar11[lVar6].field_0x60 = pQVar11[lVar6].field_0x60 & 0xfe | args->field_0x60 & 1;
    }
    else {
      if (((i != 0) || (pDVar5 == (Data *)0x0)) ||
         ((QXmlStreamAttribute *)
          ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QXmlStreamAttribute>).
          super_QArrayDataPointer<QXmlStreamAttribute>.ptr)) goto LAB_003a9f04;
      pQVar11 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
                super_QArrayDataPointer<QXmlStreamAttribute>.ptr;
      pDVar12 = (args->m_name).m_string.d;
      (args->m_name).m_string.d = (Data *)0x0;
      pQVar11[-1].m_name.m_string.d = pDVar12;
      pcVar13 = (args->m_name).m_string.ptr;
      (args->m_name).m_string.ptr = (char16_t *)0x0;
      pQVar11[-1].m_name.m_string.ptr = pcVar13;
      qVar7 = (args->m_name).m_string.size;
      (args->m_name).m_string.size = 0;
      pQVar11[-1].m_name.m_string.size = qVar7;
      pDVar12 = (args->m_namespaceUri).m_string.d;
      (args->m_namespaceUri).m_string.d = (Data *)0x0;
      pQVar11[-1].m_namespaceUri.m_string.d = pDVar12;
      pcVar13 = (args->m_namespaceUri).m_string.ptr;
      (args->m_namespaceUri).m_string.ptr = (char16_t *)0x0;
      pQVar11[-1].m_namespaceUri.m_string.ptr = pcVar13;
      qVar7 = (args->m_namespaceUri).m_string.size;
      (args->m_namespaceUri).m_string.size = 0;
      pQVar11[-1].m_namespaceUri.m_string.size = qVar7;
      pDVar12 = (args->m_qualifiedName).m_string.d;
      (args->m_qualifiedName).m_string.d = (Data *)0x0;
      pQVar11[-1].m_qualifiedName.m_string.d = pDVar12;
      pcVar13 = (args->m_qualifiedName).m_string.ptr;
      (args->m_qualifiedName).m_string.ptr = (char16_t *)0x0;
      pQVar11[-1].m_qualifiedName.m_string.ptr = pcVar13;
      qVar7 = (args->m_qualifiedName).m_string.size;
      (args->m_qualifiedName).m_string.size = 0;
      pQVar11[-1].m_qualifiedName.m_string.size = qVar7;
      pDVar12 = (args->m_value).m_string.d;
      (args->m_value).m_string.d = (Data *)0x0;
      pQVar11[-1].m_value.m_string.d = pDVar12;
      pcVar13 = (args->m_value).m_string.ptr;
      (args->m_value).m_string.ptr = (char16_t *)0x0;
      pQVar11[-1].m_value.m_string.ptr = pcVar13;
      qVar7 = (args->m_value).m_string.size;
      (args->m_value).m_string.size = 0;
      pQVar11[-1].m_value.m_string.size = qVar7;
      pQVar11[-1].field_0x60 = pQVar11[-1].field_0x60 & 0xfe | args->field_0x60 & 1;
      ppQVar1 = &(this->super_QGenericArrayOps<QXmlStreamAttribute>).
                 super_QArrayDataPointer<QXmlStreamAttribute>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QXmlStreamAttribute>).
              super_QArrayDataPointer<QXmlStreamAttribute>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }